

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# siamese.cpp
# Opt level: O0

SiameseEncoder siamese_encoder_create(void)

{
  SiameseEncoder pSVar1;
  Encoder *encoder;
  SiameseEncoder local_38;
  Encoder *in_stack_ffffffffffffffd0;
  SiameseEncoder local_8;
  
  if (m_Initialized) {
    pSVar1 = (SiameseEncoder)operator_new(0x6e8,(nothrow_t *)&std::nothrow);
    local_38 = (SiameseEncoder)0x0;
    if (pSVar1 != (SiameseEncoder)0x0) {
      siamese::Encoder::Encoder(in_stack_ffffffffffffffd0);
      local_38 = pSVar1;
    }
    local_8 = local_38;
  }
  else {
    local_8 = (SiameseEncoder)0x0;
  }
  return local_8;
}

Assistant:

SIAMESE_EXPORT SiameseEncoder siamese_encoder_create()
{
    SIAMESE_DEBUG_ASSERT(m_Initialized); // Must call siamese_init() first
    if (!m_Initialized)
        return nullptr;

    siamese::Encoder* encoder = new(std::nothrow) siamese::Encoder;

    return reinterpret_cast<SiameseEncoder>(encoder);
}